

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OjaNewton.cc
# Opt level: O0

void __thiscall OjaNewton::compute_AZx(OjaNewton *this)

{
  float *pfVar1;
  int j;
  int i;
  OjaNewton *this_local;
  
  for (i = 1; i <= this->m; i = i + 1) {
    (this->data).AZx[i] = 0.0;
    for (j = 1; j <= i; j = j + 1) {
      pfVar1 = (this->data).AZx;
      pfVar1[i] = this->A[i][j] * (this->data).Zx[j] + pfVar1[i];
    }
  }
  return;
}

Assistant:

void compute_AZx()
  {
    for (int i = 1; i <= m; i++)
    {
      data.AZx[i] = 0;
      for (int j = 1; j <= i; j++)
      {
        data.AZx[i] += A[i][j] * data.Zx[j];
      }
    }
  }